

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ball.c
# Opt level: O0

int bc_order(void)

{
  obj *local_18;
  obj *obj;
  
  if ((((uchain->ox == uball->ox) && (uchain->oy == uball->oy)) && (uball->where != '\x03')) &&
     ((u._1052_1_ & 1) == 0)) {
    for (local_18 = level->objects[uball->ox][uball->oy]; local_18 != (obj *)0x0;
        local_18 = (local_18->v).v_nexthere) {
      if (local_18 == uchain) {
        return 1;
      }
      if (local_18 == uball) {
        return 2;
      }
    }
    impossible("bc_order:  ball&chain not in same location!");
  }
  return 0;
}

Assistant:

static int bc_order(void)
{
    struct obj *obj;

    if (uchain->ox != uball->ox || uchain->oy != uball->oy || carried(uball)
		|| u.uswallow)
	return BCPOS_DIFFER;

    for (obj = level->objects[uball->ox][uball->oy]; obj; obj = obj->nexthere) {
	if (obj == uchain) return BCPOS_CHAIN;
	if (obj == uball) return BCPOS_BALL;
    }
    impossible("bc_order:  ball&chain not in same location!");
    return BCPOS_DIFFER;
}